

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_gencmn.cpp
# Opt level: O0

void addFile(char *filename,char *name,char *source,UBool sourceTOC,UBool verbose)

{
  UBool UVar1;
  uint32_t length_00;
  uint uVar2;
  int iVar3;
  char *filename_00;
  size_t sVar4;
  size_t sVar5;
  char *__dest;
  FileStream *fileStream;
  char *local_50;
  char *t;
  FileStream *file;
  char *fullPath;
  char *pcStack_30;
  uint32_t length;
  char *s;
  UBool verbose_local;
  UBool sourceTOC_local;
  char *source_local;
  char *name_local;
  char *filename_local;
  
  if (fileCount == fileMax) {
    fileMax = fileMax + 0x100;
    files = (File *)uprv_realloc_63(files,(ulong)fileMax << 5);
    if (files == (File *)0x0) {
      fprintf(_stderr,"pkgdata/gencmn: Could not allocate %u bytes for %d files\n",
              (ulong)(fileMax << 5),(ulong)fileCount);
      exit(7);
    }
  }
  if (sourceTOC == '\0') {
    UVar1 = uprv_pathIsAbsolute_63(filename);
    if (UVar1 != '\0') {
      fprintf(_stderr,
              "gencmn: Error: absolute path encountered. Old style paths are not supported. Use relative paths such as \'fur.res\' or \'translit%cfur.res\'.\n\tBad path: \'%s\'\n"
              ,0x2f,filename);
      exit(1);
    }
    filename_00 = pathToFullPath(filename,source);
    sVar4 = strlen(filename);
    sVar5 = strlen(name);
    length_00 = (int)sVar4 + (int)sVar5 + 2;
    __dest = allocString(length_00);
    strcpy(__dest,name);
    strcat(__dest,"/");
    strcat(__dest,filename);
    fixDirToTreePath(__dest);
    files[fileCount].basename = __dest;
    files[fileCount].basenameLength = length_00;
    files[fileCount].pathname = filename_00;
    basenameTotal = length_00 + basenameTotal;
    fileStream = T_FileStream_open(filename_00,"rb");
    if (fileStream == (FileStream *)0x0) {
      fprintf(_stderr,"gencmn: unable to open listed file %s\n",filename_00);
      exit(4);
    }
    uVar2 = T_FileStream_size(fileStream);
    iVar3 = T_FileStream_error(fileStream);
    if ((iVar3 != 0) || (uVar2 < 0x15)) {
      fprintf(_stderr,"gencmn: unable to get length of listed file %s\n",filename_00);
      exit(4);
    }
    T_FileStream_close(fileStream);
    if ((maxSize != 0) && (maxSize < uVar2)) {
      if (verbose == '\0') {
        return;
      }
      printf("%s ignored (size %ld > %ld)\n",filename_00,(ulong)uVar2,(ulong)maxSize);
      return;
    }
    files[fileCount].fileSize = uVar2;
  }
  else {
    sVar4 = strlen(filename);
    sVar5 = strlen(name);
    fullPath._4_4_ = (int)sVar4 + (int)sVar5 + 2;
    pcStack_30 = allocString(fullPath._4_4_);
    strcpy(pcStack_30,name);
    strcat(pcStack_30,"/");
    strcat(pcStack_30,filename);
    fixDirToTreePath(pcStack_30);
    files[fileCount].basename = pcStack_30;
    local_50 = allocString(fullPath._4_4_);
    files[fileCount].pathname = local_50;
    while (fullPath._4_4_ = fullPath._4_4_ - 1, fullPath._4_4_ != 0) {
      if (((*pcStack_30 == '.') || (*pcStack_30 == '-')) || (*pcStack_30 == '/')) {
        *local_50 = '_';
      }
      else {
        *local_50 = *pcStack_30;
      }
      pcStack_30 = pcStack_30 + 1;
      local_50 = local_50 + 1;
    }
    *local_50 = '\0';
  }
  fileCount = fileCount + 1;
  return;
}

Assistant:

static void
addFile(const char *filename, const char *name, const char *source, UBool sourceTOC, UBool verbose) {
    char *s;
    uint32_t length;
    char *fullPath = NULL;

    if(fileCount==fileMax) {
      fileMax += CHUNK_FILE_COUNT;
      files = (File *)uprv_realloc(files, fileMax*sizeof(files[0])); /* note: never freed. */
      if(files==NULL) {
        fprintf(stderr, "pkgdata/gencmn: Could not allocate %u bytes for %d files\n", (unsigned int)(fileMax*sizeof(files[0])), fileCount);
        exit(U_MEMORY_ALLOCATION_ERROR);
      }
    }

    if(!sourceTOC) {
        FileStream *file;

        if(uprv_pathIsAbsolute(filename)) {
            fprintf(stderr, "gencmn: Error: absolute path encountered. Old style paths are not supported. Use relative paths such as 'fur.res' or 'translit%cfur.res'.\n\tBad path: '%s'\n", U_FILE_SEP_CHAR, filename);
            exit(U_ILLEGAL_ARGUMENT_ERROR);
        }
        fullPath = pathToFullPath(filename, source);
        /* store the pathname */
        length = (uint32_t)(uprv_strlen(filename) + 1 + uprv_strlen(name) + 1);
        s=allocString(length);
        uprv_strcpy(s, name);
        uprv_strcat(s, U_TREE_ENTRY_SEP_STRING);
        uprv_strcat(s, filename);

        /* get the basename */
        fixDirToTreePath(s);
        files[fileCount].basename=s;
        files[fileCount].basenameLength=length;

        files[fileCount].pathname=fullPath;

        basenameTotal+=length;

        /* try to open the file */
        file=T_FileStream_open(fullPath, "rb");
        if(file==NULL) {
            fprintf(stderr, "gencmn: unable to open listed file %s\n", fullPath);
            exit(U_FILE_ACCESS_ERROR);
        }

        /* get the file length */
        length=T_FileStream_size(file);
        if(T_FileStream_error(file) || length<=20) {
            fprintf(stderr, "gencmn: unable to get length of listed file %s\n", fullPath);
            exit(U_FILE_ACCESS_ERROR);
        }

        T_FileStream_close(file);

        /* do not add files that are longer than maxSize */
        if(maxSize && length>maxSize) {
            if (verbose) {
                printf("%s ignored (size %ld > %ld)\n", fullPath, (long)length, (long)maxSize);
            }
            return;
        }
        files[fileCount].fileSize=length;
    } else {
        char *t;
        /* get and store the basename */
        /* need to include the package name */
        length = (uint32_t)(uprv_strlen(filename) + 1 + uprv_strlen(name) + 1);
        s=allocString(length);
        uprv_strcpy(s, name);
        uprv_strcat(s, U_TREE_ENTRY_SEP_STRING);
        uprv_strcat(s, filename);
        fixDirToTreePath(s);
        files[fileCount].basename=s;
        /* turn the basename into an entry point name and store in the pathname field */
        t=files[fileCount].pathname=allocString(length);
        while(--length>0) {
            if(*s=='.' || *s=='-' || *s=='/') {
                *t='_';
            } else {
                *t=*s;
            }
            ++s;
            ++t;
        }
        *t=0;
    }
    ++fileCount;
}